

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

path * __thiscall ghc::filesystem::path::operator=(path *this,string_type *source)

{
  path *ppVar1;
  string_type *source_local;
  path *this_local;
  
  ppVar1 = assign<std::__cxx11::string>(this,source);
  return ppVar1;
}

Assistant:

GHC_INLINE path& path::operator=(path::string_type&& source)
{
    return assign(source);
}